

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

Block * __thiscall
wasm::I64ToI32Lowering::lowerNe
          (I64ToI32Lowering *this,Block *result,TempVar *leftLow,TempVar *leftHigh,TempVar *rightLow
          ,TempVar *rightHigh)

{
  TempVar *any;
  Index IVar1;
  pointer this_00;
  pointer this_01;
  pointer pBVar2;
  pointer pBVar3;
  LocalGet *pLVar4;
  LocalGet *pLVar5;
  Binary *pBVar6;
  Binary *right;
  Block *pBVar7;
  Type local_58;
  Type local_50;
  Type local_48;
  Type local_40;
  TempVar *local_38;
  TempVar *rightHigh_local;
  TempVar *rightLow_local;
  TempVar *leftHigh_local;
  TempVar *leftLow_local;
  Block *result_local;
  I64ToI32Lowering *this_local;
  
  local_38 = rightHigh;
  rightHigh_local = rightLow;
  rightLow_local = leftHigh;
  leftHigh_local = leftLow;
  leftLow_local = (TempVar *)result;
  result_local = (Block *)this;
  this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                      (&this->builder);
  any = leftLow_local;
  this_01 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                      (&this->builder);
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = TempVar::operator_cast_to_unsigned_int(leftHigh_local);
  wasm::Type::Type(&local_40,i32);
  pLVar4 = Builder::makeLocalGet(pBVar3,IVar1,local_40);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = TempVar::operator_cast_to_unsigned_int(rightHigh_local);
  wasm::Type::Type(&local_48,i32);
  pLVar5 = Builder::makeLocalGet(pBVar3,IVar1,local_48);
  pBVar6 = Builder::makeBinary(pBVar2,NeInt32,(Expression *)pLVar4,(Expression *)pLVar5);
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = TempVar::operator_cast_to_unsigned_int(rightLow_local);
  wasm::Type::Type(&local_50,i32);
  pLVar4 = Builder::makeLocalGet(pBVar3,IVar1,local_50);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = TempVar::operator_cast_to_unsigned_int(local_38);
  wasm::Type::Type(&local_58,i32);
  pLVar5 = Builder::makeLocalGet(pBVar3,IVar1,local_58);
  right = Builder::makeBinary(pBVar2,NeInt32,(Expression *)pLVar4,(Expression *)pLVar5);
  pBVar6 = Builder::makeBinary(this_01,OrInt32,(Expression *)pBVar6,(Expression *)right);
  pBVar7 = Builder::blockify(this_00,(Expression *)any,(Expression *)pBVar6);
  return pBVar7;
}

Assistant:

Block* lowerNe(Block* result,
                 TempVar&& leftLow,
                 TempVar&& leftHigh,
                 TempVar&& rightLow,
                 TempVar&& rightHigh) {
    return builder->blockify(
      result,
      builder->makeBinary(
        OrInt32,
        builder->makeBinary(NeInt32,
                            builder->makeLocalGet(leftLow, Type::i32),
                            builder->makeLocalGet(rightLow, Type::i32)),
        builder->makeBinary(NeInt32,
                            builder->makeLocalGet(leftHigh, Type::i32),
                            builder->makeLocalGet(rightHigh, Type::i32))));
  }